

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
operator()(arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  iterator iVar1;
  char_type in_SIL;
  arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
  *in_RDI;
  char_spec_handler *in_stack_00000008;
  basic_format_specs<char> *in_stack_00000010;
  arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
  *this_00;
  char_spec_handler local_28 [2];
  
  this_00 = (arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
             *)in_RDI->specs_;
  char_spec_handler::char_spec_handler(local_28,in_RDI,in_SIL);
  handle_char_specs<char,duckdb_fmt::v6::internal::arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,duckdb_fmt::v6::internal::error_handler>::char_spec_handler>
            (in_stack_00000010,in_stack_00000008);
  iVar1 = out(this_00);
  return (iterator)iVar1.container;
}

Assistant:

iterator operator()(char_type value) {
    internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    return out();
  }